

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

void rlClearColor(uchar r,uchar g,uchar b,uchar a)

{
  float ca;
  float cb;
  float cg;
  float cr;
  uchar a_local;
  uchar b_local;
  uchar g_local;
  uchar r_local;
  
  (*glad_glClearColor)((float)r / 255.0,(float)g / 255.0,(float)b / 255.0,(float)a / 255.0);
  return;
}

Assistant:

void rlClearColor(unsigned char r, unsigned char g, unsigned char b, unsigned char a)
{
    // Color values clamp to 0.0f(0) and 1.0f(255)
    float cr = (float)r/255;
    float cg = (float)g/255;
    float cb = (float)b/255;
    float ca = (float)a/255;

    glClearColor(cr, cg, cb, ca);
}